

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testgamma.c
# Opt level: O1

int main(int argc,char **argv)

{
  bool bVar1;
  undefined2 uVar2;
  int iVar3;
  int iVar4;
  int extraout_EAX;
  long lVar5;
  undefined8 uVar6;
  long lVar7;
  uint uVar8;
  double dVar9;
  Uint32 flags;
  int bpp;
  int h;
  int w;
  Uint16 ramp [256];
  Uint16 red_ramp [256];
  float local_444;
  uint local_438;
  int local_434;
  int local_430;
  int local_42c;
  undefined2 local_428 [4];
  int local_420;
  undefined2 local_228;
  
  iVar3 = get_video_args(argv,&local_42c,&local_430,&local_434,&local_438);
  iVar4 = SDL_Init(0x20);
  if (iVar4 < 0) {
    main_cold_3();
    return 1;
  }
  lVar5 = SDL_SetVideoMode(local_42c,local_430,local_434,local_438 | 0x20000000);
  if (lVar5 == 0) {
    main_cold_2();
  }
  else {
    SDL_WM_SetCaption("SDL gamma test","testgamma");
    if (argv[iVar3] == (char *)0x0) {
      local_444 = 1.0;
    }
    else {
      dVar9 = atof(argv[iVar3]);
      local_444 = (float)dVar9;
    }
    iVar3 = SDL_SetGamma(local_444,local_444,local_444);
    if (-1 < iVar3) {
      uVar6 = SDL_RWFromFile("sample.bmp","rb");
      lVar7 = SDL_LoadBMP_RW(uVar6,1);
      if (lVar7 != 0) {
        iVar3 = *(int *)(lVar5 + 0x10) - *(int *)(lVar7 + 0x10);
        local_428[0] = (undefined2)((uint)(iVar3 - (iVar3 >> 0x1f)) >> 1);
        iVar3 = *(int *)(lVar5 + 0x14) - *(int *)(lVar7 + 0x14);
        local_428[1] = (undefined2)((uint)(iVar3 - (iVar3 >> 0x1f)) >> 1);
        local_428[2] = (undefined2)*(int *)(lVar7 + 0x10);
        local_428[3] = (undefined2)*(int *)(lVar7 + 0x14);
        SDL_UpperBlit(lVar7,0,lVar5,local_428);
        SDL_UpdateRects(lVar5,1,local_428);
      }
      iVar3 = SDL_GetTicks();
      iVar4 = SDL_GetTicks();
      if ((uint)(iVar4 - iVar3) < 5000) {
        uVar8 = 5000;
LAB_0010163f:
        do {
          iVar4 = SDL_PollEvent(local_428);
          if (iVar4 != 0) {
            if ((char)local_428[0] == '\x02') {
              if (0x110 < local_420) {
                if (local_420 == 0x111) {
                  local_444 = local_444 + 0.2;
                }
                else {
                  if (local_420 != 0x112) goto LAB_0010163f;
                  local_444 = local_444 + -0.2;
                }
                SDL_SetGamma(local_444,local_444,local_444);
                goto LAB_0010163f;
              }
              if (local_420 != 0x1b) {
                if (local_420 == 0x20) {
                  uVar8 = uVar8 + 5000;
                }
                goto LAB_0010163f;
              }
            }
            else if ((char)local_428[0] != '\f') goto LAB_0010163f;
            uVar8 = 0;
            goto LAB_0010163f;
          }
          iVar4 = SDL_GetTicks();
        } while ((uint)(iVar4 - iVar3) < uVar8);
      }
      if (local_444 < 10.0) {
        do {
          local_444 = local_444 + 0.1;
          lVar5 = 0;
          do {
            dVar9 = pow((double)(int)lVar5 * 0.00390625,1.0 / (double)local_444);
            iVar3 = (int)(dVar9 * 65535.0 + 0.5);
            uVar2 = (undefined2)iVar3;
            if (0xfffe < iVar3) {
              uVar2 = 0xffff;
            }
            (&local_228)[lVar5] = uVar2;
            lVar5 = lVar5 + 1;
          } while (lVar5 != 0x100);
          lVar5 = 0;
          do {
            dVar9 = pow((double)(int)lVar5 * 0.00390625,1.0 / (1.0 / (double)local_444));
            iVar3 = (int)(dVar9 * 65535.0 + 0.5);
            uVar2 = (undefined2)iVar3;
            if (0xfffe < iVar3) {
              uVar2 = 0xffff;
            }
            local_428[lVar5] = uVar2;
            lVar5 = lVar5 + 1;
          } while (lVar5 != 0x100);
          SDL_SetGammaRamp(&local_228,local_428,local_428);
        } while (local_444 < 10.0);
      }
      memset(&local_228,0xff,0x200);
      memset(local_428,0,0x200);
      SDL_SetGammaRamp(&local_228,local_428,local_428);
      uVar8 = (uint)local_228._1_1_;
      do {
        memset(&local_228,uVar8,0x200);
        SDL_SetGammaRamp(&local_228,0,0);
        bVar1 = 0 < (int)uVar8;
        uVar8 = uVar8 - 1;
      } while (bVar1);
      SDL_Delay(1000);
      SDL_Quit();
      return 0;
    }
  }
  main_cold_1();
  return extraout_EAX;
}

Assistant:

int main(int argc, char *argv[])
{
	SDL_Surface *screen;
	SDL_Surface *image;
	float gamma;
	int i;
	int w, h, bpp;
	Uint32 flags;
	Uint16 ramp[256];
	Uint16 red_ramp[256];
	Uint32 then, timeout;

	/* Check command line arguments */
	argv += get_video_args(argv, &w, &h, &bpp, &flags);

	/* Initialize SDL */
	if ( SDL_Init(SDL_INIT_VIDEO) < 0 ) {
		fprintf(stderr,
			"Couldn't initialize SDL: %s\n", SDL_GetError());
		return(1);
	}

	/* Initialize the display, always use hardware palette */
	screen = SDL_SetVideoMode(w, h, bpp, flags | SDL_HWPALETTE);
	if ( screen == NULL ) {
		fprintf(stderr, "Couldn't set %dx%d video mode: %s\n",
						w, h, SDL_GetError());
		quit(1);
	}

	/* Set the window manager title bar */
	SDL_WM_SetCaption("SDL gamma test", "testgamma");

	/* Set the desired gamma, if any */
	gamma = 1.0f;
	if ( *argv ) {
		gamma = (float)atof(*argv);
	}
	if ( SDL_SetGamma(gamma, gamma, gamma) < 0 ) {
		fprintf(stderr, "Unable to set gamma: %s\n", SDL_GetError());
		quit(1);
	}

#if 0 /* This isn't supported.  Integrating the gamma ramps isn't exact */
	/* See what gamma was actually set */
	float real[3];
	if ( SDL_GetGamma(&real[0], &real[1], &real[2]) < 0 ) {
		printf("Couldn't get gamma: %s\n", SDL_GetError());
	} else {
		printf("Set gamma values: R=%2.2f, G=%2.2f, B=%2.2f\n",
			real[0], real[1], real[2]);
	}
#endif

	/* Do all the drawing work */
	image = SDL_LoadBMP("sample.bmp");
	if ( image ) {
		SDL_Rect dst;

		dst.x = (screen->w - image->w)/2;
		dst.y = (screen->h - image->h)/2;
		dst.w = image->w;
		dst.h = image->h;
		SDL_BlitSurface(image, NULL, screen, &dst);
		SDL_UpdateRects(screen, 1, &dst);
	}

	/* Wait a bit, handling events */
	then = SDL_GetTicks();
	timeout = (5*1000);
	while ( (SDL_GetTicks()-then) < timeout ) {
		SDL_Event event;

		while ( SDL_PollEvent(&event) ) {
			switch (event.type) {
			    case SDL_QUIT:	/* Quit now */
				timeout = 0;
				break;
			    case SDL_KEYDOWN:
				switch (event.key.keysym.sym) {
				    case SDLK_SPACE:	/* Go longer.. */
					timeout += (5*1000);
					break;
				    case SDLK_UP:
					gamma += 0.2f;
					SDL_SetGamma(gamma, gamma, gamma);
					break;
				    case SDLK_DOWN:
					gamma -= 0.2f;
					SDL_SetGamma(gamma, gamma, gamma);
					break;
				    case SDLK_ESCAPE:
					timeout = 0;
					break;
				    default:
					break;
				}
				break;
			}
		}
	}

	/* Perform a gamma flash to red using color ramps */
	while ( gamma < 10.0 ) {
		/* Increase the red gamma and decrease everything else... */
		gamma += 0.1f;
		CalculateGamma(gamma, red_ramp);
		CalculateGamma(1.0/gamma, ramp);
		SDL_SetGammaRamp(red_ramp, ramp, ramp);
	}
	/* Finish completely red */
	memset(red_ramp, 255, sizeof(red_ramp));
	memset(ramp, 0, sizeof(ramp));
	SDL_SetGammaRamp(red_ramp, ramp, ramp);

	/* Now fade out to black */
	for ( i=(red_ramp[0] >> 8); i >= 0; --i ) {
		memset(red_ramp, i, sizeof(red_ramp));
		SDL_SetGammaRamp(red_ramp, NULL, NULL);
	}
	SDL_Delay(1*1000);

	SDL_Quit();
	return(0);
}